

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

void intgemm::CompareEps<float>(float *reference,float *actual,Index size,float epsilon)

{
  float *value;
  float *value_00;
  ulong uVar1;
  float fVar2;
  float local_150;
  float threshold;
  SourceLineInfo local_148;
  float *local_138;
  float *local_130;
  ulong local_128;
  StringRef local_120;
  BinaryExpr<const_float_&,_const_float_&> local_110;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage1;
  
  local_128 = (ulong)size;
  local_138 = actual;
  local_130 = reference;
  for (uVar1 = 0; uVar1 != local_128; uVar1 = uVar1 + 1) {
    local_110.super_ITransientExpression._vptr_ITransientExpression =
         (_func_int **)(anon_var_dwarf_18a79d + 9);
    local_110.super_ITransientExpression.m_isBinaryExpression = true;
    local_110.super_ITransientExpression.m_result = false;
    local_110.super_ITransientExpression._10_6_ = 0;
    local_148.file = "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/test.h";
    local_148.line = 0x28;
    Catch::MessageBuilder::MessageBuilder
              ((MessageBuilder *)&catchAssertionHandler,(StringRef *)&local_110,&local_148,Info);
    std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.lineInfo.file,"Inaccurate at ")
    ;
    std::ostream::_M_insert<unsigned_long>
              ((ulong)catchAssertionHandler.m_assertionInfo.lineInfo.file);
    std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.lineInfo.file,' ');
    value = local_130 + uVar1;
    Catch::ReusableStringStream::operator<<((ReusableStringStream *)&catchAssertionHandler,value);
    std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.lineInfo.file,' ');
    value_00 = local_138 + uVar1;
    Catch::ReusableStringStream::operator<<((ReusableStringStream *)&catchAssertionHandler,value_00)
    ;
    Catch::ScopedMessage::ScopedMessage(&scopedMessage1,(MessageBuilder *)&catchAssertionHandler);
    Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&catchAssertionHandler);
    fVar2 = ABS(*value);
    if (fVar2 <= 0.01) {
      fVar2 = 0.01;
    }
    threshold = fVar2 * epsilon;
    local_110.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x18fab9;
    local_110.super_ITransientExpression.m_isBinaryExpression = true;
    local_110.super_ITransientExpression.m_result = false;
    local_110.super_ITransientExpression._10_6_ = 0;
    local_148.file = "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/test.h";
    local_148.line = 0x2b;
    Catch::StringRef::StringRef(&local_120,"std::fabs(reference[i] - actual[i]) < threshold");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_110,&local_148,local_120,ContinueOnFailure
              );
    local_150 = ABS(*value - *value_00);
    local_148.file = (char *)&local_150;
    Catch::ExprLhs<float_const&>::operator<
              (&local_110,(ExprLhs<float_const&> *)&local_148,&threshold);
    Catch::AssertionHandler::handleExpr
              (&catchAssertionHandler,&local_110.super_ITransientExpression);
    Catch::ITransientExpression::~ITransientExpression(&local_110.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    Catch::ScopedMessage::~ScopedMessage(&scopedMessage1);
  }
  return;
}

Assistant:

void CompareEps(const Type* reference, const Type* actual, Index size, Type epsilon) {
  for (Index i = 0; i < size; ++i) {
    INFO("Inaccurate at " << i << ' ' << reference[i] << ' ' << actual[i]);
    // Ratio to maximum value.
    float threshold = epsilon * std::max<float>(0.01f, std::fabs(reference[i]));
    CHECK(std::fabs(reference[i] - actual[i]) < threshold);
  }
}